

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O2

void __thiscall
TasGrid::GridWavelet::getDifferentiationWeights(GridWavelet *this,double *x,double *weights)

{
  uint uVar1;
  size_type __n;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  allocator_type local_51;
  size_type local_50;
  vector<double,_std::allocator<double>_> local_weights;
  
  lVar5 = 0x18;
  if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar5 = 0x40;
  }
  uVar1 = *(uint *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar5);
  local_50 = (size_type)(int)uVar1;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; __n = local_50, uVar6 != uVar4; uVar4 = uVar4 + 1) {
    evalDiffBasis(this,(int *)(*(long *)((long)&(this->super_BaseCanonicalGrid).
                                                _vptr_BaseCanonicalGrid + lVar5) * uVar4 * 4 +
                              *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions +
                                       lVar5)),x,
                  weights + (long)(int)uVar4 * (long)(this->super_BaseCanonicalGrid).num_dimensions)
    ;
  }
  if ((this->inter_matrix).num_rows != (int)local_50) {
    buildInterpolationMatrix(this);
  }
  ::std::vector<double,_std::allocator<double>_>::vector(&local_weights,__n,&local_51);
  uVar4 = (ulong)(uint)(this->super_BaseCanonicalGrid).num_dimensions;
  for (lVar5 = 0; lVar5 < (int)uVar4; lVar5 = lVar5 + 1) {
    pdVar2 = weights;
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = *pdVar2;
      pdVar2 = pdVar2 + (int)uVar4;
    }
    TasSparse::WaveletBasisMatrix::invertTransposed
              (&this->inter_matrix,(this->super_BaseCanonicalGrid).acceleration,
               local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    uVar4 = (ulong)(this->super_BaseCanonicalGrid).num_dimensions;
    pdVar2 = weights;
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      *pdVar2 = local_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
      pdVar2 = pdVar2 + uVar4;
    }
    weights = weights + 1;
  }
  ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_weights.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void GridWavelet::getDifferentiationWeights(const double x[], double weights[]) const {
    const MultiIndexSet &work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();
    #pragma omp parallel for
    for (int i=0; i<num_points; i++) {
        evalDiffBasis(work.getIndex(i), x, &(weights[i * num_dimensions]));
    }
    if (inter_matrix.getNumRows() != num_points) buildInterpolationMatrix();
    // Solve the linear wavelet system for each direction/partial derivative and re-index.
    std::vector<double> local_weights(num_points);
    for (int d=0; d<num_dimensions; d++) {
        for (int i=0; i<num_points; i++)
            local_weights[i] = weights[i * num_dimensions + d];
        inter_matrix.invertTransposed(acceleration, local_weights.data());
        for (int i=0; i<num_points; i++)
            weights[i * num_dimensions + d] = local_weights[i];
    }
}